

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O1

optional<bool>
unodb::detail::olc_impl_helpers::
remove_or_choose_subtree<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_inode_48<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
          (olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *inode,
          byte key_byte,basic_art_key<unsigned_long> k,
          olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *db_instance,
          read_critical_section *parent_critical_section,
          read_critical_section *node_critical_section,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          *node_in_parent,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          **child_in_parent,read_critical_section *child_critical_section,node_type *child_type,
          olc_node_ptr *child)

{
  atomic<long> *paVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  byte bVar5;
  ulong uVar6;
  __int_type_conflict _Var7;
  __int_type_conflict _Var8;
  long *plVar9;
  long lVar10;
  write_guard wVar11;
  bool bVar12;
  ushort uVar13;
  int iVar14;
  pthread_t pVar15;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *piVar16;
  void *extraout_RDX;
  undefined7 in_register_00000031;
  ushort uVar17;
  optimistic_lock *poVar18;
  write_guard local_70;
  write_guard child_guard_1;
  __atomic_base<unsigned_long> local_60;
  write_guard node_guard;
  __atomic_base<unsigned_long> local_48;
  write_guard node_guard_1;
  write_guard local_38;
  write_guard child_guard;
  
  bVar5 = (inode->super_olc_inode_48_parent<unsigned_long,_std::span<const_std::byte>_>).
          child_indexes._M_elems[CONCAT71(in_register_00000031,key_byte) & 0xffffffff].value.
          super___atomic_base<unsigned_char>._M_i;
  piVar16 = (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)
            ((long)&(inode->super_olc_inode_48_parent<unsigned_long,_std::span<const_std::byte>_>).
                    children + (ulong)bVar5 * 8);
  if (bVar5 == 0xff) {
    poVar18 = parent_critical_section->lock;
    _Var7 = (parent_critical_section->version).version;
    if ((poVar18->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_001d5130;
    _Var8 = (poVar18->version).version.super___atomic_base<unsigned_long>._M_i;
    if (_Var7 != _Var8) {
      LOCK();
      paVar1 = &poVar18->read_lock_count;
      lVar3 = (paVar1->super___atomic_base<long>)._M_i;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0) goto LAB_001d5111;
      if (_Var7 != _Var8) goto LAB_001d5104;
    }
    LOCK();
    paVar1 = &poVar18->read_lock_count;
    lVar3 = (paVar1->super___atomic_base<long>)._M_i;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
    UNLOCK();
    if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0) goto LAB_001d5111;
    parent_critical_section->lock = (optimistic_lock *)0x0;
    if (_Var7 != _Var8) goto LAB_001d4f11;
    poVar18 = node_critical_section->lock;
    _Var7 = (node_critical_section->version).version;
    if ((poVar18->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_001d5130;
    _Var8 = (poVar18->version).version.super___atomic_base<unsigned_long>._M_i;
    if (_Var7 == _Var8) {
LAB_001d4d0b:
      LOCK();
      paVar1 = &poVar18->read_lock_count;
      lVar3 = (paVar1->super___atomic_base<long>)._M_i;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0) {
LAB_001d5111:
        __assert_fail("old_value > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                      ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
      }
    }
    else {
      LOCK();
      paVar1 = &poVar18->read_lock_count;
      lVar3 = (paVar1->super___atomic_base<long>)._M_i;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0) goto LAB_001d5111;
      if (_Var7 == _Var8) goto LAB_001d4d0b;
    }
    bVar12 = _Var7 == _Var8;
    node_critical_section->lock = (optimistic_lock *)0x0;
LAB_001d4dfa:
    uVar17 = (ushort)bVar12;
    uVar13 = 0;
  }
  else {
    child->tagged_ptr = (piVar16->value)._M_i.tagged_ptr;
    node_guard_1.lock = (optimistic_lock *)node_critical_section;
    bVar12 = optimistic_lock::check
                       (node_critical_section->lock,
                        (version_type)(node_critical_section->version).version);
    if (bVar12) {
      child_guard_1.lock = &db_instance->root_pointer_lock;
      optimistic_lock::try_read_lock((optimistic_lock *)&stack0xffffffffffffffa0);
      child_critical_section->lock = (optimistic_lock *)local_60._M_i;
      local_60._M_i = 0;
      (child_critical_section->version).version = (version_tag_type)node_guard.lock;
      optimistic_lock::read_critical_section::~read_critical_section
                ((read_critical_section *)&stack0xffffffffffffffa0);
      if (child_critical_section->lock != (optimistic_lock *)0x0) {
        uVar6 = child->tagged_ptr;
        *child_type = (node_type)uVar6 & (I256|I48);
        if ((uVar6 & 7) != 0) {
          *child_in_parent = piVar16;
          poVar18 = parent_critical_section->lock;
          _Var7 = (parent_critical_section->version).version;
          if ((poVar18->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_001d5130;
          _Var8 = (poVar18->version).version.super___atomic_base<unsigned_long>._M_i;
          if (_Var7 == _Var8) {
LAB_001d4c87:
            LOCK();
            paVar1 = &poVar18->read_lock_count;
            lVar3 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
            goto LAB_001d5111;
          }
          else {
            LOCK();
            paVar1 = &poVar18->read_lock_count;
            lVar3 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
            goto LAB_001d5111;
            if (_Var7 == _Var8) goto LAB_001d4c87;
          }
          uVar17 = (ushort)(_Var7 == _Var8);
          parent_critical_section->lock = (optimistic_lock *)0x0;
LAB_001d4ca4:
          uVar13 = 1;
          goto LAB_001d4dfc;
        }
        iVar14 = basic_leaf<unsigned_long,_unodb::detail::olc_node_header>::cmp
                           ((basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *)
                            (uVar6 & 0xfffffffffffffff8),(void *)k.field_0,extraout_RDX);
        if (iVar14 != 0) {
          poVar18 = parent_critical_section->lock;
          _Var7 = (parent_critical_section->version).version;
          if ((poVar18->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_001d5130;
          _Var8 = (poVar18->version).version.super___atomic_base<unsigned_long>._M_i;
          if (_Var7 != _Var8) {
            LOCK();
            paVar1 = &poVar18->read_lock_count;
            lVar3 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
            goto LAB_001d5111;
            if (_Var7 != _Var8) {
LAB_001d5104:
              parent_critical_section->lock = (optimistic_lock *)0x0;
              goto LAB_001d4f11;
            }
          }
          LOCK();
          paVar1 = &poVar18->read_lock_count;
          lVar3 = (paVar1->super___atomic_base<long>)._M_i;
          (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
          UNLOCK();
          if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0) goto LAB_001d5111;
          parent_critical_section->lock = (optimistic_lock *)0x0;
          if (_Var7 != _Var8) goto LAB_001d4f11;
          plVar9 = (long *)((node_guard_1.lock)->version).version.super___atomic_base<unsigned_long>
                           ._M_i;
          lVar3 = ((node_guard_1.lock)->read_lock_count).super___atomic_base<long>._M_i;
          if (plVar9[1] < 1) goto LAB_001d5130;
          lVar10 = *plVar9;
          if (lVar3 != lVar10) {
            LOCK();
            plVar2 = plVar9 + 1;
            lVar4 = *plVar2;
            *plVar2 = *plVar2 + -1;
            UNLOCK();
            if (SBORROW8(lVar4,1) != *plVar2 < 0) goto LAB_001d5111;
            if (lVar3 != lVar10) {
              ((node_guard_1.lock)->version).version.super___atomic_base<unsigned_long>._M_i = 0;
              goto LAB_001d4f11;
            }
          }
          LOCK();
          plVar9 = plVar9 + 1;
          lVar4 = *plVar9;
          *plVar9 = *plVar9 + -1;
          UNLOCK();
          if (SBORROW8(lVar4,1) != *plVar9 < 0) goto LAB_001d5111;
          ((node_guard_1.lock)->version).version.super___atomic_base<unsigned_long>._M_i = 0;
          if (lVar3 != lVar10) goto LAB_001d4f11;
          poVar18 = child_critical_section->lock;
          _Var7 = (child_critical_section->version).version;
          if ((poVar18->read_lock_count).super___atomic_base<long>._M_i < 1) {
LAB_001d5130:
            __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                          ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
          }
          _Var8 = (poVar18->version).version.super___atomic_base<unsigned_long>._M_i;
          if (_Var7 == _Var8) {
LAB_001d4dde:
            LOCK();
            paVar1 = &poVar18->read_lock_count;
            lVar3 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
            goto LAB_001d5111;
          }
          else {
            LOCK();
            paVar1 = &poVar18->read_lock_count;
            lVar3 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
            goto LAB_001d5111;
            if (_Var7 == _Var8) goto LAB_001d4dde;
          }
          bVar12 = _Var7 == _Var8;
          child_critical_section->lock = (optimistic_lock *)0x0;
          goto LAB_001d4dfa;
        }
        if ((inode->super_olc_inode_48_parent<unsigned_long,_std::span<const_std::byte>_>).
            field_0x20 == '\x11') {
          basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
          ::
          make_db_inode_unique_ptr<unodb::detail::olc_inode_16<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::olc_inode_48<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>&>
                    ((basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
                      *)&stack0xffffffffffffffa0,(db_type *)child_guard_1.lock,inode);
          bVar12 = optimistic_lock::try_upgrade_to_write_lock
                             (parent_critical_section->lock,
                              (version_type)(parent_critical_section->version).version);
          wVar11 = node_guard_1;
          local_38.lock = (optimistic_lock *)0x0;
          if (bVar12) {
            local_38.lock = parent_critical_section->lock;
          }
          parent_critical_section->lock = (optimistic_lock *)0x0;
          if (local_38.lock != (optimistic_lock *)0x0) {
            bVar12 = optimistic_lock::try_upgrade_to_write_lock
                               ((optimistic_lock *)
                                ((node_guard_1.lock)->version).version.
                                super___atomic_base<unsigned_long>._M_i,
                                (version_type)
                                ((node_guard_1.lock)->read_lock_count).super___atomic_base<long>.
                                _M_i);
            local_48._M_i = 0;
            if (bVar12) {
              local_48._M_i =
                   ((wVar11.lock)->version).version.super___atomic_base<unsigned_long>._M_i;
            }
            ((wVar11.lock)->version).version.super___atomic_base<unsigned_long>._M_i = 0;
            if (local_48._M_i != 0) {
              bVar12 = optimistic_lock::try_upgrade_to_write_lock
                                 (child_critical_section->lock,
                                  (version_type)(child_critical_section->version).version);
              poVar18 = (optimistic_lock *)0x0;
              if (bVar12) {
                poVar18 = child_critical_section->lock;
              }
              child_critical_section->lock = (optimistic_lock *)0x0;
              local_70.lock = poVar18;
              if (poVar18 != (optimistic_lock *)0x0) {
                olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
                init((olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>
                      *)node_guard.lock,(EVP_PKEY_CTX *)child_guard_1.lock);
                wVar11 = node_guard;
                node_guard.lock = (optimistic_lock *)0x0;
                if (((ulong)wVar11.lock & 7) != 0) {
                  __assert_fail("(result & ptr_bit_mask) == uintptr",
                                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal.hpp"
                                ,0x182,
                                "static std::uintptr_t unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>::tag_ptr(const Header *, unodb::node_type) [Header = unodb::detail::olc_node_header]"
                               );
                }
                (node_in_parent->value)._M_i.tagged_ptr = (ulong)wVar11.lock | 2;
                if (local_48._M_i != 0) {
                  __assert_fail("!node_guard.active()",
                                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                                ,0x644,
                                "static std::optional<bool> unodb::detail::olc_impl_helpers::remove_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, olc_db<Key, Value> &, optimistic_lock::read_critical_section &, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, in_critical_section<olc_node_ptr> **, optimistic_lock::read_critical_section *, node_type *, olc_node_ptr *) [Key = unsigned long, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_48<unsigned long, std::span<const std::byte>>]"
                               );
                }
                if (local_70.lock != (optimistic_lock *)0x0) {
                  __assert_fail("!child_guard.active()",
                                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                                ,0x645,
                                "static std::optional<bool> unodb::detail::olc_impl_helpers::remove_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, olc_db<Key, Value> &, optimistic_lock::read_critical_section &, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, in_critical_section<olc_node_ptr> **, optimistic_lock::read_critical_section *, node_type *, olc_node_ptr *) [Key = unsigned long, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_48<unsigned long, std::span<const std::byte>>]"
                               );
                }
                *child_in_parent =
                     (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                      *)0x0;
                optimistic_lock::write_guard::~write_guard(&local_70);
                optimistic_lock::write_guard::~write_guard((write_guard *)&local_48);
                optimistic_lock::write_guard::~write_guard(&local_38);
                std::
                unique_ptr<unodb::detail::olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                               *)&stack0xffffffffffffffa0);
                if (poVar18 != (optimistic_lock *)0x0) {
                  LOCK();
                  child_guard_1.lock[0x1b].read_lock_count.super___atomic_base<long>._M_i =
                       child_guard_1.lock[0x1b].read_lock_count.super___atomic_base<long>._M_i + 1;
                  UNLOCK();
                  uVar13 = 1;
                  uVar17 = 1;
                  goto LAB_001d4dfc;
                }
                goto LAB_001d4f11;
              }
              optimistic_lock::write_guard::~write_guard(&local_70);
            }
            optimistic_lock::write_guard::~write_guard((write_guard *)&local_48);
          }
          optimistic_lock::write_guard::~write_guard(&local_38);
          std::
          unique_ptr<unodb::detail::olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
          ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                         *)&stack0xffffffffffffffa0);
        }
        else {
          poVar18 = parent_critical_section->lock;
          _Var7 = (parent_critical_section->version).version;
          if ((poVar18->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_001d5130;
          _Var8 = (poVar18->version).version.super___atomic_base<unsigned_long>._M_i;
          if (_Var7 != _Var8) {
            LOCK();
            paVar1 = &poVar18->read_lock_count;
            lVar3 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
            goto LAB_001d5111;
            if (_Var7 != _Var8) goto LAB_001d5104;
          }
          LOCK();
          paVar1 = &poVar18->read_lock_count;
          lVar3 = (paVar1->super___atomic_base<long>)._M_i;
          (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
          UNLOCK();
          if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0) goto LAB_001d5111;
          parent_critical_section->lock = (optimistic_lock *)0x0;
          if (_Var7 == _Var8) {
            bVar12 = optimistic_lock::try_upgrade_to_write_lock
                               ((optimistic_lock *)
                                ((node_guard_1.lock)->version).version.
                                super___atomic_base<unsigned_long>._M_i,
                                (version_type)
                                ((node_guard_1.lock)->read_lock_count).super___atomic_base<long>.
                                _M_i);
            uVar17 = 0;
            local_60._M_i = 0;
            if (bVar12) {
              local_60._M_i =
                   ((node_guard_1.lock)->version).version.super___atomic_base<unsigned_long>._M_i;
            }
            ((node_guard_1.lock)->version).version.super___atomic_base<unsigned_long>._M_i = 0;
            if (local_60._M_i != 0) {
              bVar12 = optimistic_lock::try_upgrade_to_write_lock
                                 (child_critical_section->lock,
                                  (version_type)(child_critical_section->version).version);
              poVar18 = (optimistic_lock *)0x0;
              if (bVar12) {
                poVar18 = child_critical_section->lock;
              }
              child_critical_section->lock = (optimistic_lock *)0x0;
              local_38.lock = poVar18;
              if (poVar18 != (optimistic_lock *)0x0) {
                optimistic_lock::atomic_version_type::write_unlock_and_obsolete(&poVar18->version);
                pVar15 = pthread_self();
                (poVar18->obsoleter_thread)._M_thread = pVar15;
                local_38.lock = (optimistic_lock *)0x0;
                olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
                remove(inode,(char *)(ulong)key_byte);
                *child_in_parent =
                     (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                      *)0x0;
              }
              uVar17 = (ushort)(poVar18 != (optimistic_lock *)0x0);
              optimistic_lock::write_guard::~write_guard(&local_38);
            }
            optimistic_lock::write_guard::~write_guard((write_guard *)&stack0xffffffffffffffa0);
            goto LAB_001d4ca4;
          }
        }
      }
    }
    else {
      ((node_guard_1.lock)->version).version.super___atomic_base<unsigned_long>._M_i = 0;
    }
LAB_001d4f11:
    uVar13 = 0;
    uVar17 = 0;
  }
LAB_001d4dfc:
  return (_Optional_base<bool,_true,_true>)(uVar13 | uVar17 << 8);
}

Assistant:

[[nodiscard]] std::optional<bool> olc_impl_helpers::remove_or_choose_subtree(
    INode& inode, std::byte key_byte, basic_art_key<Key> k,
    olc_db<Key, Value>& db_instance,
    optimistic_lock::read_critical_section& parent_critical_section,
    optimistic_lock::read_critical_section& node_critical_section,
    in_critical_section<olc_node_ptr>* node_in_parent,
    in_critical_section<olc_node_ptr>** child_in_parent,
    optimistic_lock::read_critical_section* child_critical_section,
    node_type* child_type, olc_node_ptr* child) {
  const auto [child_i, found_child]{inode.find_child(key_byte)};

  if (found_child == nullptr) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    return false;
  }

  *child = found_child->load();

  if (UNODB_DETAIL_UNLIKELY(!node_critical_section.check())) return {};

  auto& child_lock{node_ptr_lock(*child)};
  *child_critical_section = child_lock.try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(child_critical_section->must_restart())) return {};

  *child_type = child->type();

  if (*child_type != node_type::LEAF) {
    *child_in_parent = found_child;
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    return true;
  }

  const auto* const leaf{child->ptr<olc_leaf_type<Key, Value>*>()};
  if (!leaf->matches(k)) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!child_critical_section->try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    return false;
  }

  const auto is_node_min_size{inode.is_min_size()};

  if (UNODB_DETAIL_LIKELY(!is_node_min_size)) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    const optimistic_lock::write_guard node_guard{
        std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    child_guard.unlock_and_obsolete();

    inode.remove(child_i, db_instance);

    *child_in_parent = nullptr;
    return true;
  }

  UNODB_DETAIL_ASSERT(is_node_min_size);

  if constexpr (std::is_same_v<INode, olc_inode_4<Key, Value>>) {
    const optimistic_lock::write_guard parent_guard{
        std::move(parent_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

    optimistic_lock::write_guard node_guard{std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    auto current_node{olc_art_policy<Key, Value>::make_db_inode_reclaimable_ptr(
        &inode, db_instance)};
    node_guard.unlock_and_obsolete();
    child_guard.unlock_and_obsolete();
    *node_in_parent = current_node->leave_last_child(child_i, db_instance);

    UNODB_DETAIL_ASSERT(!node_guard.active());
    UNODB_DETAIL_ASSERT(!child_guard.active());

    *child_in_parent = nullptr;
  } else {
    auto smaller_node{INode::smaller_derived_type::create(db_instance, inode)};

    const optimistic_lock::write_guard parent_guard{
        std::move(parent_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

    optimistic_lock::write_guard node_guard{std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    smaller_node->init(db_instance, inode, node_guard, child_i, child_guard);
    *node_in_parent = detail::olc_node_ptr{smaller_node.release(),
                                           INode::smaller_derived_type::type};

    UNODB_DETAIL_ASSERT(!node_guard.active());
    UNODB_DETAIL_ASSERT(!child_guard.active());

    *child_in_parent = nullptr;
  }

#ifdef UNODB_DETAIL_WITH_STATS
  db_instance.template account_shrinking_inode<INode::type>();
#endif  // UNODB_DETAIL_WITH_STATS

  return true;
}